

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::visitParamDecl(CheckerVisitor *this,ParamDecl *p)

{
  Expr *pEVar1;
  FunctionInfo *pFVar2;
  SymbolInfo *info;
  ValueRef *v;
  SQChar *local_28;
  
  (*(this->super_Visitor)._vptr_Visitor[0x2a])();
  pEVar1 = (p->super_ValueDecl)._expr;
  info = makeSymbolInfo(this,SK_PARAM);
  v = makeValueRef(this,info);
  v->state = VRS_UNKNOWN;
  v->expression = (Expr *)0x0;
  (info->declarator).p = p;
  info->ownedScope = this->currentScope;
  info->used = p->_isVararg;
  if (((pEVar1 != (Expr *)0x0) && ((pEVar1->super_Node)._op == TO_LITERAL)) &&
     (*(int *)&(pEVar1->super_Node).field_0x1c == 4)) {
    *(byte *)&v->flagsPositive = (byte)v->flagsPositive | 2;
  }
  declareSymbol(this,(p->super_ValueDecl)._name,v);
  if (this->effectsOnly == false) {
    pFVar2 = this->currentInfo;
    local_28 = normalizeParamName(this,(p->super_ValueDecl)._name,(SQChar *)0x0);
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&pFVar2->parameters,&local_28);
  }
  return;
}

Assistant:

void CheckerVisitor::visitParamDecl(ParamDecl *p) {
  Visitor::visitParamDecl(p);

  const Expr *dv = p->defaultValue();

  SymbolInfo *info = makeSymbolInfo(SK_PARAM);
  ValueRef *v = makeValueRef(info);
  v->state = VRS_UNKNOWN;
  v->expression = nullptr;
  info->declarator.p = p;
  info->ownedScope = currentScope;
  info->used = p->isVararg();

  if (dv && dv->op() == TO_LITERAL) {
    if (dv->asLiteral()->kind() == LK_NULL) {
      v->flagsPositive |= RT_NULL;
    }
  }

  declareSymbol(p->name(), v);

  assert(currentInfo);
  if (!effectsOnly)
    currentInfo->parameters.push_back(normalizeParamName(p->name()));
}